

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O3

Tcl_HashEntry * OneWordCreate(Tcl_HashTable *tablePtr,char *key,int *newPtr)

{
  int iVar1;
  Tcl_HashEntry *pTVar2;
  Tcl_HashEntry *pTVar3;
  
  pTVar3 = (Tcl_HashEntry *)
           (tablePtr->buckets +
           (int)((uint)((long)key * 0x41c64e6d >> ((byte)tablePtr->downShift & 0x3f)) &
                tablePtr->mask));
  pTVar2 = pTVar3;
  do {
    pTVar2 = pTVar2->nextPtr;
    if (pTVar2 == (Tcl_HashEntry *)0x0) {
      *newPtr = 1;
      pTVar2 = (Tcl_HashEntry *)malloc(0x28);
      pTVar2->tablePtr = tablePtr;
      pTVar2->bucketPtr = (Tcl_HashEntry **)pTVar3;
      pTVar2->nextPtr = pTVar3->nextPtr;
      pTVar2->clientData = (ClientData)0x0;
      (pTVar2->key).oneWordValue = key;
      pTVar3->nextPtr = pTVar2;
      iVar1 = tablePtr->numEntries + 1;
      tablePtr->numEntries = iVar1;
      if (iVar1 < tablePtr->rebuildSize) {
        return pTVar2;
      }
      RebuildTable(tablePtr);
      return pTVar2;
    }
  } while ((pTVar2->key).oneWordValue != key);
  *newPtr = 0;
  return pTVar2;
}

Assistant:

static Tcl_HashEntry *
OneWordCreate(Tcl_HashTable *tablePtr, register char *key, int *newPtr)
{
    register Tcl_HashEntry *hPtr;
    int index;

    index = RANDOM_INDEX(tablePtr, key);

    /* 
     * Search all of the entries in this bucket.
     */

    for (hPtr = tablePtr->buckets[index]; hPtr != NULL;
	 hPtr = hPtr->nextPtr) {
	if (hPtr->key.oneWordValue == key) {
	    *newPtr = 0;
	    return hPtr;
	}
    }

    /* 
     * Entry not found.  Add a new one to the bucket.
     */

    *newPtr = 1;
    hPtr = (Tcl_HashEntry *) malloc(sizeof(Tcl_HashEntry));
    hPtr->tablePtr = tablePtr;
    hPtr->bucketPtr = &(tablePtr->buckets[index]);
    hPtr->nextPtr = *hPtr->bucketPtr;
    hPtr->clientData = 0;
    hPtr->key.oneWordValue = key;
    *hPtr->bucketPtr = hPtr;
    tablePtr->numEntries++;

    /* 
     * If the table has exceeded a decent size, rebuild it with many
     * more buckets.
     */

    if (tablePtr->numEntries >= tablePtr->rebuildSize) {
	RebuildTable(tablePtr);
    }
    return hPtr;
}